

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O2

int ON_ParseAngleExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,double *angle_value,
              ON_ParseSettings *parse_results,AngleUnitSystem *str_angle_unit_system)

{
  wchar_t *str_00;
  wchar_t wVar1;
  double dVar2;
  double dVar3;
  byte bVar4;
  ON_ParseSettings parse_settings_00;
  ON_ParseSettings parse_settings_01;
  ON_ParseSettings parse_settings_02;
  ON_ParseSettings parse_settings_03;
  ON__UINT32 aOVar5 [2];
  ON__UINT32 aOVar6 [2];
  undefined8 uVar7;
  ON__UINT16 OVar8;
  ON__UINT8 OVar9;
  ON__UINT8 OVar10;
  ON__UINT64 OVar11;
  AngleUnitSystem *pAVar12;
  undefined8 uVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  ON_ParseSettings *pOVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  uint uVar26;
  AngleUnitSystem angle_us;
  int local_118;
  AngleUnitSystem next_us;
  double x;
  double *local_108;
  AngleUnitSystem *local_100;
  ON_ParseSettings *local_f8;
  wchar_t *local_f0;
  ON_ParseSettings input_parse_settings;
  ON_ParseSettings pr;
  undefined4 local_98;
  undefined4 uStack_94;
  double local_88;
  double next_value;
  ON_ParseSettings pr1;
  ON_ParseSettings next_pr;
  
  OVar11 = ON_ParseSettings::FalseSettings.m_reserved;
  uVar7 = ON_ParseSettings::FalseSettings._16_8_;
  aOVar6 = ON_ParseSettings::FalseSettings.m_false_default_bits;
  aOVar5 = ON_ParseSettings::FalseSettings.m_true_default_bits;
  x = -1.23432101234321e+308;
  angle_us = None;
  input_parse_settings.m_reserved_bits = parse_settings.m_reserved_bits;
  input_parse_settings.m_context_locale_id = parse_settings.m_context_locale_id;
  input_parse_settings.m_context_angle_unit_system = parse_settings.m_context_angle_unit_system;
  input_parse_settings.m_context_length_unit_system = parse_settings.m_context_length_unit_system;
  input_parse_settings.m_reserved = parse_settings.m_reserved;
  input_parse_settings.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
  input_parse_settings.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
  input_parse_settings.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
  input_parse_settings.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
  pr._16_8_ = ON_ParseSettings::FalseSettings._16_8_;
  pr.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
  pr.m_true_default_bits = ON_ParseSettings::FalseSettings.m_true_default_bits;
  pr.m_false_default_bits = ON_ParseSettings::FalseSettings.m_false_default_bits;
  if (angle_value != (double *)0x0) {
    *angle_value = -1.23432101234321e+308;
  }
  if (str_angle_unit_system != (AngleUnitSystem *)0x0) {
    *str_angle_unit_system = None;
  }
  uVar13 = ON_ParseSettings::FalseSettings._16_8_;
  if (parse_results != (ON_ParseSettings *)0x0) {
    ON_ParseSettings::FalseSettings.m_reserved_bits = (ON__UINT32)uVar7;
    ON_ParseSettings::FalseSettings.m_context_locale_id = SUB82(uVar7,4);
    OVar8 = ON_ParseSettings::FalseSettings.m_context_locale_id;
    ON_ParseSettings::FalseSettings.m_context_angle_unit_system = SUB81(uVar7,6);
    OVar9 = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    ON_ParseSettings::FalseSettings.m_context_length_unit_system = SUB81(uVar7,7);
    OVar10 = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    parse_results->m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    ON_ParseSettings::FalseSettings._16_8_ = uVar13;
    parse_results->m_context_locale_id = OVar8;
    parse_results->m_context_angle_unit_system = OVar9;
    parse_results->m_context_length_unit_system = OVar10;
    parse_results->m_reserved = OVar11;
    *&parse_results->m_true_default_bits = aOVar5;
    *&parse_results->m_false_default_bits = aOVar6;
  }
  local_108 = angle_value;
  bVar14 = ON_ParseSettings::ParseSurveyorsNotation(&input_parse_settings);
  local_100 = str_angle_unit_system;
  local_f8 = parse_results;
  local_f0 = str;
  if (bVar14) {
    local_118 = 0;
    uVar21 = 0;
    if (0 < str_count || str_count == -1) {
      bVar14 = ON_ParseSettings::ParseLeadingWhiteSpace(&input_parse_settings);
      uVar21 = 0;
      if (bVar14) {
        bVar14 = ON_ParseSettings::IsLeadingWhiteSpace(&input_parse_settings,*str);
        uVar21 = 0;
        if (bVar14) {
          ON_ParseSettings::SetParseLeadingWhiteSpace(&pr,true);
          uVar22 = 0;
          uVar21 = 0;
          if (0 < str_count) {
            uVar21 = (ulong)(uint)str_count;
          }
          for (; uVar21 != uVar22; uVar22 = uVar22 + 1) {
            bVar14 = ON_ParseSettings::IsLeadingWhiteSpace(&input_parse_settings,str[uVar22]);
            if (!bVar14) {
              uVar21 = uVar22 & 0xffffffff;
              break;
            }
          }
        }
      }
    }
    iVar20 = (int)uVar21;
    ON_ParseSettings::SetParseLeadingWhiteSpace(&input_parse_settings,false);
    bVar4 = 1;
    if ((str_count == -1) || (iVar20 + 3 <= str_count)) {
      wVar1 = str[uVar21];
      iVar16 = 0x4e;
      if (wVar1 != L'N') {
        if (wVar1 != L's') {
          if (wVar1 == L'n') goto LAB_00573196;
          if (wVar1 != L'S') goto LAB_005731ac;
        }
        iVar16 = 0x53;
      }
LAB_00573196:
      iVar20 = iVar20 + 1;
      bVar4 = 0;
      ON_ParseSettings::SetParseIntegerDashFraction(&input_parse_settings,false);
      local_118 = iVar16;
    }
LAB_005731ac:
    uVar19 = 0;
    iVar16 = 0;
    if (0 < str_count) {
      iVar16 = iVar20;
    }
    pr1.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    pr1.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
    pr1.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    pr1.m_context_length_unit_system = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    pr1.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
    pr1.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
    pr1.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
    pr1.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
    pr1.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
    str_00 = str + iVar20;
    parse_settings_01.m_false_default_bits[0] = input_parse_settings.m_false_default_bits[0];
    parse_settings_01.m_false_default_bits[1] = input_parse_settings.m_false_default_bits[1];
    parse_settings_01.m_true_default_bits[0] = input_parse_settings.m_true_default_bits[0];
    parse_settings_01.m_true_default_bits[1] = input_parse_settings.m_true_default_bits[1];
    parse_settings_01.m_reserved_bits = input_parse_settings.m_reserved_bits;
    parse_settings_01.m_context_locale_id = input_parse_settings.m_context_locale_id;
    parse_settings_01.m_context_angle_unit_system = input_parse_settings.m_context_angle_unit_system
    ;
    parse_settings_01.m_context_length_unit_system =
         input_parse_settings.m_context_length_unit_system;
    parse_settings_01.m_reserved = input_parse_settings.m_reserved;
    uVar17 = ON_ParseNumberExpression(str_00,str_count - iVar16,parse_settings_01,&pr1,&x);
    if ((int)uVar17 < 1) {
      bVar15 = ON_ParseSettings::ParseScientificENotation(&input_parse_settings);
      bVar14 = false;
      if (bVar15) {
        ON_ParseSettings::SetParseScientificENotation(&input_parse_settings,false);
        parse_settings_02.m_false_default_bits[0] = input_parse_settings.m_false_default_bits[0];
        parse_settings_02.m_false_default_bits[1] = input_parse_settings.m_false_default_bits[1];
        parse_settings_02.m_true_default_bits[0] = input_parse_settings.m_true_default_bits[0];
        parse_settings_02.m_true_default_bits[1] = input_parse_settings.m_true_default_bits[1];
        parse_settings_02.m_reserved_bits = input_parse_settings.m_reserved_bits;
        parse_settings_02.m_context_locale_id = input_parse_settings.m_context_locale_id;
        parse_settings_02.m_context_angle_unit_system =
             input_parse_settings.m_context_angle_unit_system;
        parse_settings_02.m_context_length_unit_system =
             input_parse_settings.m_context_length_unit_system;
        parse_settings_02.m_reserved = input_parse_settings.m_reserved;
        uVar19 = ON_ParseNumberExpression(str_00,str_count - iVar16,parse_settings_02,&pr,&x);
        if ((int)uVar19 < 1) {
          return 0;
        }
        if ((local_f0[uVar19] | 0x20U) != 0x65) {
          return 0;
        }
        bVar14 = false;
      }
    }
    else {
      if ((bool)(bVar4 & x <= 0.0)) {
        bVar14 = Internal_IsNegativeInteger(&input_parse_settings,str_00,uVar17 - iVar20);
      }
      else {
        bVar14 = false;
      }
      ON_ParseSettings::operator|=(&pr,&pr1);
      uVar19 = uVar17;
    }
    uVar19 = uVar19 + iVar20;
    str = local_f0;
  }
  else {
    parse_settings_00.m_false_default_bits[0] = input_parse_settings.m_false_default_bits[0];
    parse_settings_00.m_false_default_bits[1] = input_parse_settings.m_false_default_bits[1];
    parse_settings_00.m_true_default_bits[0] = input_parse_settings.m_true_default_bits[0];
    parse_settings_00.m_true_default_bits[1] = input_parse_settings.m_true_default_bits[1];
    parse_settings_00.m_reserved_bits = input_parse_settings.m_reserved_bits;
    parse_settings_00.m_context_locale_id = input_parse_settings.m_context_locale_id;
    parse_settings_00.m_context_angle_unit_system = input_parse_settings.m_context_angle_unit_system
    ;
    parse_settings_00.m_context_length_unit_system =
         input_parse_settings.m_context_length_unit_system;
    parse_settings_00.m_reserved = input_parse_settings.m_reserved;
    uVar19 = ON_ParseNumberExpression(str,str_count,parse_settings_00,&pr,&x);
    if ((int)uVar19 < 1) {
      return 0;
    }
    if (x <= 0.0) {
      local_118 = 0;
      bVar14 = Internal_IsNegativeInteger(&input_parse_settings,str,uVar19);
    }
    else {
      local_118 = 0;
      bVar14 = false;
    }
  }
  uVar17 = str_count;
  if ((0 < str_count) && (uVar17 = str_count - uVar19, str_count < (int)uVar19)) {
    return 0;
  }
  uVar18 = ON_ParseSettings::PreferedLocaleId(&parse_settings);
  uVar18 = ON_ParseAngleUnitName(str + (int)uVar19,uVar17,uVar18,&angle_us);
  pOVar23 = local_f8;
  dVar3 = x;
  bVar15 = false;
  if (angle_us == Degrees) {
    bVar15 = bVar14;
  }
  if (bVar14 == false) {
    bVar15 = bVar14;
  }
  if ((int)uVar18 < 1) {
    angle_us = ON_ParseSettings::DefaultAngleUnitSystem(&parse_settings);
    pOVar23 = local_f8;
  }
  else {
    if ((0 < (int)uVar17) && (bVar14 = uVar17 < uVar18, uVar17 = uVar17 - uVar18, bVar14)) {
      return 0;
    }
    uVar19 = uVar18 + uVar19;
    if (uVar17 == 0xffffffff) {
      if (angle_us == Degrees) goto LAB_005733ac;
      uVar17 = 0xffffffff;
    }
    else if ((int)(uVar19 + 1) < (int)uVar17 && angle_us == Degrees) {
LAB_005733ac:
      dVar2 = floor(x);
      if (((((((dVar2 == dVar3) && (!NAN(dVar2) && !NAN(dVar3))) &&
             (bVar14 = ON_ParseSettings::ParseArcDegreesMinutesSeconds(&input_parse_settings),
             bVar14)) &&
            ((bVar14 = ON_ParseSettings::ParseSignificandDecimalPoint(&pr), !bVar14 &&
             (bVar14 = ON_ParseSettings::ParseScientificENotation(&pr), !bVar14)))) &&
           ((bVar14 = ON_ParseSettings::ParseRationalNumber(&pr), !bVar14 &&
            ((bVar14 = ON_ParseSettings::ParsePi(&pr), !bVar14 &&
             (bVar14 = ON_ParseSettings::ParseDivision(&pr), !bVar14)))))) &&
          (bVar14 = ON_ParseSettings::ParseMultiplication(&pr), !bVar14)) &&
         (bVar14 = ON_ParseSettings::ParseIntegerDashFraction(&pr), !bVar14)) {
        pr1.m_reserved_bits = input_parse_settings.m_reserved_bits;
        pr1.m_context_locale_id = input_parse_settings.m_context_locale_id;
        pr1.m_context_angle_unit_system = input_parse_settings.m_context_angle_unit_system;
        pr1.m_context_length_unit_system = input_parse_settings.m_context_length_unit_system;
        pr1.m_reserved = input_parse_settings.m_reserved;
        pr1.m_true_default_bits[0] = input_parse_settings.m_true_default_bits[0];
        pr1.m_true_default_bits[1] = input_parse_settings.m_true_default_bits[1];
        pr1.m_false_default_bits[0] = input_parse_settings.m_false_default_bits[0];
        pr1.m_false_default_bits[1] = input_parse_settings.m_false_default_bits[1];
        local_f8 = pOVar23;
        DisableStartAndExpressionParsingStuff(&pr1);
        uVar18 = 0;
        ON_ParseSettings::SetParseSignificandDigitSeparators(&pr1,false);
        ON_ParseSettings::SetParseIntegerDashFraction(&pr1,false);
        ON_ParseSettings::SetParseRationalNumber(&pr1,false);
        ON_ParseSettings::SetParsePi(&pr1,false);
        ON_ParseSettings::SetParseSurveyorsNotation(&pr1,false);
        ON_ParseSettings::SetParseUnaryMinus(&pr1,false);
        ON_ParseSettings::SetParseUnaryPlus(&pr1,false);
        local_98 = 0;
        uStack_94 = 0;
        uVar25 = 0;
        uVar26 = 0;
        while (bVar14 = bVar15, uVar18 < 2) {
          iVar20 = ~uVar19 + uVar17;
          next_value = -1.23432101234321e+308;
          next_us = None;
          next_pr.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
          next_pr.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
          next_pr.m_context_angle_unit_system =
               ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
          next_pr.m_context_length_unit_system =
               ON_ParseSettings::FalseSettings.m_context_length_unit_system;
          next_pr.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
          next_pr.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
          next_pr.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
          next_pr.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
          next_pr.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
          if (uVar17 == 0xffffffff) {
            iVar20 = -1;
          }
          parse_settings_03.m_false_default_bits[0] = pr1.m_false_default_bits[0];
          parse_settings_03.m_false_default_bits[1] = pr1.m_false_default_bits[1];
          parse_settings_03.m_true_default_bits[0] = pr1.m_true_default_bits[0];
          parse_settings_03.m_true_default_bits[1] = pr1.m_true_default_bits[1];
          parse_settings_03.m_reserved_bits = pr1.m_reserved_bits;
          parse_settings_03.m_context_locale_id = pr1.m_context_locale_id;
          parse_settings_03.m_context_angle_unit_system = pr1.m_context_angle_unit_system;
          parse_settings_03.m_context_length_unit_system = pr1.m_context_length_unit_system;
          parse_settings_03.m_reserved = pr1.m_reserved;
          iVar20 = ON_ParseAngleExpression
                             (local_f0 + (int)uVar19,iVar20,parse_settings_03,&next_value,&next_pr,
                              &next_us);
          if (((iVar20 < 1) || (bVar14 = false, next_value < 0.0)) || (60.0 <= next_value)) break;
          if ((uVar18 == 0) && (next_us == Minutes)) {
            uVar18 = 1;
            local_98 = SUB84(next_value,0);
            uStack_94 = (undefined4)((ulong)next_value >> 0x20);
            local_88 = (double)CONCAT44(uVar26,uVar25);
          }
          else {
            local_88 = next_value;
            if (next_us != Seconds) {
              bVar14 = false;
              break;
            }
            uVar18 = 2;
          }
          uVar19 = uVar19 + iVar20;
          ON_ParseSettings::SetParseArcDegreesMinutesSeconds(&pr,true);
          ON_ParseSettings::operator|=(&pr,&next_pr);
          uVar25 = SUB84(local_88,0);
          uVar26 = (uint)((ulong)local_88 >> 0x20);
        }
        if (((bVar14 != false) && (x <= 0.0)) && (0.0 <= (double)CONCAT44(uStack_94,local_98))) {
          bVar14 = 0.0 <= (double)CONCAT44(uVar26,uVar25);
          if (bVar14) {
            dVar3 = -(double)CONCAT44(uStack_94,local_98);
            uVar24 = (int)((ulong)dVar3 >> 0x20);
            if ((double)CONCAT44(uStack_94,local_98) <= dVar3) {
              uVar24 = uStack_94;
            }
            uStack_94 = uVar24;
            if (bVar14 && (double)CONCAT44(uVar26,uVar25) != 0.0) {
              uVar26 = uVar26 ^ 0x80000000;
            }
          }
        }
        pOVar23 = local_f8;
        if (((double)CONCAT44(uVar26,uVar25) != 0.0) || (NAN((double)CONCAT44(uVar26,uVar25)))) {
          x = (x * 60.0 + (double)CONCAT44(uStack_94,local_98)) * 60.0 +
              (double)CONCAT44(uVar26,uVar25);
          angle_us = Seconds;
        }
        else if (((double)CONCAT44(uStack_94,local_98) != 0.0) ||
                (NAN((double)CONCAT44(uStack_94,local_98)))) {
          x = x * 60.0 + (double)CONCAT44(uStack_94,local_98);
          angle_us = Minutes;
        }
      }
    }
  }
  pAVar12 = local_100;
  if ((local_118 == 0) || ((int)uVar19 < 1)) goto LAB_00573581;
  if ((0 < (int)uVar17) && ((int)uVar17 <= (int)uVar19)) {
    return 0;
  }
  wVar1 = local_f0[uVar19];
  iVar20 = 0x45;
  if (wVar1 != L'E') {
    if (wVar1 != L'w') {
      if (wVar1 == L'e') goto LAB_005734cd;
      if (wVar1 != L'W') {
        return 0;
      }
    }
    iVar20 = 0x57;
  }
LAB_005734cd:
  if (angle_us == None) {
    angle_us = Degrees;
  }
  uVar19 = uVar19 + 1;
  dVar3 = ON::AngleUnitScale(Turns,angle_us);
  dVar3 = dVar3 * 0.25;
  if (local_118 == 0x53) {
    if (iVar20 == 0x57) {
      x = -(dVar3 + x);
    }
    else {
      if (iVar20 != 0x45) {
        return 0;
      }
      x = -(dVar3 - x);
    }
  }
  else {
    if (local_118 != 0x4e) {
      return 0;
    }
    if (iVar20 == 0x57) {
      x = dVar3 + x;
    }
    else {
      if (iVar20 != 0x45) {
        return 0;
      }
      x = dVar3 - x;
    }
  }
LAB_00573581:
  if (local_108 != (double *)0x0) {
    *local_108 = x;
  }
  if (pOVar23 != (ON_ParseSettings *)0x0) {
    pOVar23->m_reserved_bits = pr.m_reserved_bits;
    pOVar23->m_context_locale_id = pr.m_context_locale_id;
    pOVar23->m_context_angle_unit_system = pr.m_context_angle_unit_system;
    pOVar23->m_context_length_unit_system = pr.m_context_length_unit_system;
    pOVar23->m_reserved = pr.m_reserved;
    *&pOVar23->m_true_default_bits = pr.m_true_default_bits;
    *&pOVar23->m_false_default_bits = pr.m_false_default_bits;
  }
  if (pAVar12 != (AngleUnitSystem *)0x0) {
    *pAVar12 = angle_us;
    return uVar19;
  }
  return uVar19;
}

Assistant:

int ON_ParseAngleExpression( 
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  double* angle_value,
  ON_ParseSettings* parse_results,
  ON::AngleUnitSystem* str_angle_unit_system
  )
{
  double x = ON_UNSET_VALUE;
  ON::AngleUnitSystem angle_us = ON::AngleUnitSystem::None;
  ON_ParseSettings input_parse_settings(parse_settings);
  ON_ParseSettings pr = ON_ParseSettings::FalseSettings;
  if ( 0 != angle_value )
    *angle_value = ON_UNSET_VALUE;
  if ( 0 != str_angle_unit_system )
    *str_angle_unit_system = angle_us;
  if ( 0 != parse_results )
    *parse_results = pr;

  bool bNegativeDegreesMinutesSecondsIsPossible = false;
  int str_index = 0;
  ON__UINT32 cSurveyorsNotationNS = 0;
  ON__UINT32 cSurveyorsNotationEW = 0;
  if ( input_parse_settings.ParseSurveyorsNotation() )
  {
    if (    (str_index < str_count || -1 == str_count)
         && input_parse_settings.ParseLeadingWhiteSpace() 
         && input_parse_settings.IsLeadingWhiteSpace(str[str_index])
       )
    {
      // skip over leading white space
      pr.SetParseLeadingWhiteSpace(true);
      while ( str_index < str_count && input_parse_settings.IsLeadingWhiteSpace(str[str_index]) )
      {
        str_index++;
      }
    }

    input_parse_settings.SetParseLeadingWhiteSpace(false);

    if ( ((str_index+3 <= str_count) || -1 == str_count) )
    {
      // Do not localize "N" or "n" or "S" or "s".  
      // These letters are specified by Surveyor's notation specification.
      // [TODO - Reference needed].
      switch(str[str_index])
      {
      case 'N': // Do not localize this letter
      case 'n': // Do not localize this letter
        str_index++;
        cSurveyorsNotationNS = 'N';
        break;
      case 'S': // Do not localize this letter
      case 's': // Do not localize this letter
        str_index++;
        cSurveyorsNotationNS = 'S';
        break;
      }
    }

    if ( 0 != cSurveyorsNotationNS )
    {
      input_parse_settings.SetParseIntegerDashFraction(false);
    }

    const int str_number_count = (str_count > 0 ? str_count-str_index : str_count);
    ON_ParseSettings pr1(ON_ParseSettings::FalseSettings);
    int str_number_index = ON_ParseNumberExpression(str+str_index,str_number_count,input_parse_settings,&pr1,&x);
    if ( str_number_index > 0 )
    {
      if (0 == cSurveyorsNotationNS && x <= 0.0 && Internal_IsNegativeInteger(input_parse_settings, str + str_index, str_number_index - str_index))
        bNegativeDegreesMinutesSecondsIsPossible = true;
      pr |= pr1;
    }
    else
    {
      if ( input_parse_settings.ParseScientificENotation() )
      {
        // It may be that the string looked like N15.23E and the number parser failed
        // because 15.23E is an invalid attempt at using scientific E notation.
        input_parse_settings.SetParseScientificENotation(false);
        str_number_index = ON_ParseNumberExpression(str+str_index,str_number_count,input_parse_settings,&pr,&x);
        if ( str_number_index <= 0 )
          return 0;
        if ( 'E' != str[str_number_index] && 'e' != str[str_number_index] )
          return 0;
      }
    }
    str_index += str_number_index;
  }
  else
  {
    str_index = ON_ParseNumberExpression(str,str_count,input_parse_settings,&pr,&x);
    if ( str_index <= 0 )
      return 0;
    if (0 == cSurveyorsNotationNS && x <= 0.0 && Internal_IsNegativeInteger(input_parse_settings, str, str_index))
      bNegativeDegreesMinutesSecondsIsPossible = true;
  }

  if ( str_count > 0 )
  {
    if (str_index > str_count )
      return 0;
    str_count -= str_index;
  }

  int end_of_unit_index = ON_ParseAngleUnitName(str+str_index,str_count,parse_settings.PreferedLocaleId(),&angle_us);

  if (bNegativeDegreesMinutesSecondsIsPossible && ON::AngleUnitSystem::Degrees != angle_us)
    bNegativeDegreesMinutesSecondsIsPossible = false;

  if ( end_of_unit_index > 0 )
  {
    if ( str_count > 0 )
    {
      if (end_of_unit_index > str_count )
        return 0;
      str_count -= end_of_unit_index;
    }
    str_index += end_of_unit_index;

    if ( -1 == str_count || str_index+1 < str_count )
    {
      if ( ON::AngleUnitSystem::Degrees == angle_us 
           && floor(x) == x
           && input_parse_settings.ParseArcDegreesMinutesSeconds() 
           && false == pr.ParseSignificandDecimalPoint()
           && false == pr.ParseScientificENotation()
           && false == pr.ParseRationalNumber()
           && false == pr.ParsePi()
           && false == pr.ParseDivision()
           && false == pr.ParseMultiplication()
           && false == pr.ParseIntegerDashFraction()
         )
      {
        // parse arc minutes
        ON_ParseSettings next_parse_settings = input_parse_settings;
        DisableStartAndExpressionParsingStuff(next_parse_settings);
        next_parse_settings.SetParseSignificandDigitSeparators(false);
        next_parse_settings.SetParseIntegerDashFraction(false);
        next_parse_settings.SetParseRationalNumber(false);
        next_parse_settings.SetParsePi(false);
        next_parse_settings.SetParseSurveyorsNotation(false);
        next_parse_settings.SetParseUnaryMinus(false);
        next_parse_settings.SetParseUnaryPlus(false);

        double arc_minutes_value = 0.0;
        double arc_seconds_value = 0.0;

        for ( int next_value_pass = 0; next_value_pass < 2; next_value_pass++ )
        {
          double next_value = ON_UNSET_VALUE;
          ON::AngleUnitSystem next_us(ON::AngleUnitSystem::None);
          ON_ParseSettings next_pr(ON_ParseSettings::FalseSettings);
          int next_str_index = ON_ParseAngleExpression(
            str+str_index,
            ((-1 == str_count) ? str_count : (str_count-str_index-1)),
            next_parse_settings,&next_value,&next_pr,&next_us);

          if ( next_str_index <= 0 )
            break;

          if (!(next_value >= 0.0 && next_value < 60.0))
          {
            bNegativeDegreesMinutesSecondsIsPossible = false;
            break;
          }

          if ( 0 == next_value_pass )
          {
            if ( ON::AngleUnitSystem::Minutes != next_us )
            {
              if ( ON::AngleUnitSystem::Seconds == next_us && 0 == next_value_pass )
                next_value_pass = 1;
              else
              {
                bNegativeDegreesMinutesSecondsIsPossible = false;
                break;
              }
            }
          }
          else if ( 1 == next_value_pass )
          {
            if (ON::AngleUnitSystem::Seconds != next_us)
            {
              bNegativeDegreesMinutesSecondsIsPossible = false;              
              break;
            }
          }

          if (ON::AngleUnitSystem::Minutes == next_us)
            arc_minutes_value = next_value;
          else if (ON::AngleUnitSystem::Seconds == next_us)
            arc_seconds_value = next_value;
          else
            bNegativeDegreesMinutesSecondsIsPossible = false;

          str_index += next_str_index;
          pr.SetParseArcDegreesMinutesSeconds(true);
          pr |= next_pr;
        }

        if (
          bNegativeDegreesMinutesSecondsIsPossible
          && x <= 0.0 
          && arc_minutes_value >= 0.0 
          && arc_seconds_value >= 0.0
          )
        {
          // parsing something like -90d40'30"
          if (arc_minutes_value > 0.0)
            arc_minutes_value = -arc_minutes_value;
          if (arc_seconds_value > 0.0)
            arc_seconds_value = -arc_seconds_value;
        }

        if ( 0 != arc_seconds_value )
        {
          x = 60.0*(60.0*x + arc_minutes_value) + arc_seconds_value;
          angle_us = ON::AngleUnitSystem::Seconds;
        }
        else if ( 0 != arc_minutes_value )
        {
          x = 60.0*x + arc_minutes_value;
          angle_us = ON::AngleUnitSystem::Minutes;
        }
      }
    }
  }
  else
  {
    bNegativeDegreesMinutesSecondsIsPossible = false;
    angle_us = parse_settings.DefaultAngleUnitSystem();
  }

  if ( str_index > 0 && 0 != cSurveyorsNotationNS )
  {
    if ( str_count > 0 )
    {
      if (str_index+1 > str_count )
        return 0;
    }

    // Do not localize "E" or "e" or "W" or "w".  
    // These letters are specified by Surveyor's notation specification.
    // [TODO - Reference needed].
    switch(str[str_index])
    {
    case 'E': // Do not localize this letter
    case 'e': // Do not localize this letter
      str_index++;
      cSurveyorsNotationEW = 'E';
      break;
    case 'W': // Do not localize this letter
    case 'w': // Do not localize this letter
      str_index++;
      cSurveyorsNotationEW = 'W';
      break;
    default:
      cSurveyorsNotationEW = 0;
      break;
    }

    if (0 == cSurveyorsNotationEW )
      return 0;

    if ( ON::AngleUnitSystem::None == angle_us )
    {
      // Surveyor's notation implies degrees when no angle unit
      // is explicitly supplied.  This is done because it is
      // difficult for many users to enter a degree symbol
      // when typing input and Surveyor's notation is almost
      // always in degrees. [TODO cite reference].
      angle_us = ON::AngleUnitSystem::Degrees;
    }

    // The value of right_angle is calculated this way because it will
    // yield the most precise result in all angle unit systems since
    // IEEE double multiplication by 0.25 is exact and the value
    // returned by ON::AngleUnitScale(ON::turns,angle_us) is exact 
    // for all supported angle units except radians where pi rounded
    // because the IEEE double must approximate the value of pi.
    const double right_angle = 0.25*ON::AngleUnitScale(ON::AngleUnitSystem::Turns,angle_us);

    switch(cSurveyorsNotationNS)
    {
    case 'N':
      switch(cSurveyorsNotationEW)
      {
      case 'E': // N<angle>E
        x = right_angle - x;
        break;
      case 'W': // N<angle>W
        x = right_angle + x;
        break;
      default:
        return 0;
      }
      break;
    case 'S':
      switch(cSurveyorsNotationEW)
      {
      case 'E': // S<angle>E
        x =  -(right_angle - x);
        break;
      case 'W': // S<angle>W
        x =  -(right_angle + x);
        break;
      default:
        return 0;
      }
      break;
    default:
      return 0;
    }
  }

  if ( angle_value )
    *angle_value = x;
  if ( 0 != parse_results )
    *parse_results = pr;
  if ( 0 != str_angle_unit_system )
    *str_angle_unit_system = angle_us;

  return str_index;
}